

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O2

void __thiscall
mtmd_context::mtmd_context
          (mtmd_context *this,char *mmproj_fname,llama_model *text_model,
          mtmd_context_params *ctx_params)

{
  bool bVar1;
  int iVar2;
  llama_token lVar3;
  clip_ctx *ctx;
  runtime_error *this_00;
  undefined8 uVar4;
  clip_context_params ctx_params_00;
  allocator<char> local_51;
  string local_50;
  
  (this->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->print_timings = ctx_params->print_timings;
  this->n_threads = ctx_params->n_threads;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->image_marker,ctx_params->image_marker,(allocator<char> *)&local_50);
  this->slice_tmpl = MTMD_SLICE_TMPL_NONE;
  this->tok_ov_img_start = -1;
  this->tok_ov_img_end = -1;
  this->tok_slices_start = -1;
  this->tok_slices_end = -1;
  this->tok_slices_end = -1;
  this->tok_sli_img_start = -1;
  this->tok_sli_img_end = -1;
  this->tok_row_end = -1;
  ctx_params_00 =
       (clip_context_params)((ulong)ctx_params->verbosity << 0x20 | (ulong)ctx_params->use_gpu);
  ctx = clip_init(mmproj_fname,ctx_params_00);
  this->ctx_clip = ctx;
  if (ctx == (clip_ctx *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_(&local_50,(char *)ctx_params_00,mmproj_fname);
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->text_model = text_model;
  bVar1 = clip_is_qwen2vl(ctx);
  if (!bVar1) {
    iVar2 = clip_is_minicpmv(this->ctx_clip);
    if (iVar2 == 2) {
      this->slice_tmpl = MTMD_SLICE_TMPL_MINICPMV_2_5;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<image>",&local_51);
      lVar3 = lookup_token(this,&local_50);
      this->tok_ov_img_start = lVar3;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"</image>",&local_51);
      lVar3 = lookup_token(this,&local_50);
      this->tok_ov_img_end = lVar3;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<slice>",&local_51);
      lVar3 = lookup_token(this,&local_50);
      this->tok_slices_start = lVar3;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"</slice>",&local_51);
      lVar3 = lookup_token(this,&local_50);
      this->tok_slices_end = lVar3;
      std::__cxx11::string::~string((string *)&local_50);
      this->tok_sli_img_start = this->tok_ov_img_start;
      this->tok_sli_img_end = this->tok_ov_img_end;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\n",&local_51);
      lVar3 = lookup_token(this,&local_50);
    }
    else {
      if (1 < iVar2 - 3U) {
        if (iVar2 == 0) {
          return;
        }
        goto LAB_001338ec;
      }
      this->slice_tmpl = MTMD_SLICE_TMPL_MINICPMV_2_6;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<image>",&local_51);
      lVar3 = lookup_token(this,&local_50);
      this->tok_ov_img_start = lVar3;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"</image>",&local_51);
      lVar3 = lookup_token(this,&local_50);
      this->tok_ov_img_end = lVar3;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<slice>",&local_51);
      lVar3 = lookup_token(this,&local_50);
      this->tok_sli_img_start = lVar3;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"</slice>",&local_51);
      lVar3 = lookup_token(this,&local_50);
      this->tok_sli_img_end = lVar3;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\n",&local_51);
      lVar3 = lookup_token(this,&local_50);
    }
    this->tok_row_end = lVar3;
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
             ,0x3d,"GGML_ASSERT(%s) failed",
             "!clip_is_qwen2vl(ctx_clip) && \"Qwen2VL model is not supported yet, use llama-qwen2vl-cli instead\""
            );
LAB_001338ec:
  uVar4 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                     ,0x57,"GGML_ASSERT(%s) failed","false && \"unsupported minicpmv version\"");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&this->image_marker);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->image_embd_v).super__Vector_base<float,_std::allocator<float>_>);
  _Unwind_Resume(uVar4);
}

Assistant:

mtmd_context(const char * mmproj_fname,
                   const llama_model * text_model,
                   const mtmd_context_params & ctx_params) :
        print_timings(ctx_params.print_timings),
        n_threads    (ctx_params.n_threads),
        image_marker (ctx_params.image_marker)
    {
        clip_context_params ctx_clip_params;
        ctx_clip_params.use_gpu   = ctx_params.use_gpu;
        ctx_clip_params.verbosity = ctx_params.verbosity;
        ctx_clip = clip_init(mmproj_fname, ctx_clip_params);
        if (!ctx_clip) {
            throw std::runtime_error(string_format("Failed to load CLIP model from %s\n", mmproj_fname));
        }
        this->text_model = text_model;

        GGML_ASSERT(!clip_is_qwen2vl(ctx_clip) && "Qwen2VL model is not supported yet, use llama-qwen2vl-cli instead");

        int minicpmv_version = clip_is_minicpmv(ctx_clip);
        if (minicpmv_version == 2) {
            // minicpmv 2.5 format:
            // <image> (overview) </image><slice><image> (slice) </image><image> (slice) </image>\n ... </slice>
            slice_tmpl        = MTMD_SLICE_TMPL_MINICPMV_2_5;
            tok_ov_img_start  = lookup_token("<image>");
            tok_ov_img_end    = lookup_token("</image>");
            tok_slices_start  = lookup_token("<slice>");
            tok_slices_end    = lookup_token("</slice>");
            tok_sli_img_start = tok_ov_img_start;
            tok_sli_img_end   = tok_ov_img_end;
            tok_row_end       = lookup_token("\n");

        } else if (minicpmv_version == 3 || minicpmv_version == 4) {
            // minicpmv 2.6 format:
            // <image> (overview) </image><slice> (slice) </slice><slice> (slice) </slice>\n ...
            slice_tmpl        = MTMD_SLICE_TMPL_MINICPMV_2_6;
            tok_ov_img_start  = lookup_token("<image>");
            tok_ov_img_end    = lookup_token("</image>");
            tok_sli_img_start = lookup_token("<slice>");
            tok_sli_img_end   = lookup_token("</slice>");
            tok_row_end       = lookup_token("\n");

        } else if (minicpmv_version != 0) {
            GGML_ASSERT(false && "unsupported minicpmv version");
        }
    }